

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

MethodOptions *
google::protobuf::Arena::CreateMessageInternal<google::protobuf::MethodOptions>(Arena *arena)

{
  MethodOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (MethodOptions *)operator_new(0x50);
    MethodOptions::MethodOptions(this,(Arena *)0x0,false);
  }
  else {
    this = (MethodOptions *)
           AllocateAlignedWithHook(arena,0x50,(type_info *)&MethodOptions::typeinfo);
    MethodOptions::MethodOptions(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }